

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::GetNextDiscontinuity
          (ON_RevSurface *this,int dir,continuity c,double t0,double t1,double *t,int *hint,
          int *dtype,double cos_angle_tolerance,double curvature_tolerance)

{
  ON_Circle *this_00;
  double t0_00;
  double t1_00;
  int iVar1;
  int *local_2d8;
  int *local_2a0;
  undefined1 local_258 [8];
  ON_ArcCurve arc_curve;
  undefined1 local_178 [8];
  ON_Arc arc;
  ON_Circle circle;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int *dtype_local;
  int *hint_local;
  double *t_local;
  double t1_local;
  double t0_local;
  continuity c_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  if ((uint)((this->m_bTransposed & 1U) != 0) == dir) {
    this_00 = (ON_Circle *)(arc.m_angle.m_t + 1);
    ON_Circle::ON_Circle(this_00,&ON_xy_plane,1.0);
    ON_Arc::ON_Arc((ON_Arc *)local_178,this_00,(ON_Interval)*&(this->m_angle).m_t);
    t0_00 = ON_Interval::operator[](&this->m_t,0);
    t1_00 = ON_Interval::operator[](&this->m_t,1);
    ON_ArcCurve::ON_ArcCurve((ON_ArcCurve *)local_258,(ON_Arc *)local_178,t0_00,t1_00);
    if (hint == (int *)0x0) {
      local_2a0 = (int *)0x0;
    }
    else {
      local_2a0 = hint + dir;
    }
    circle.radius._7_1_ =
         ON_Curve::GetNextDiscontinuity
                   ((ON_Curve *)local_258,c,t0,t1,t,local_2a0,dtype,cos_angle_tolerance,
                    curvature_tolerance);
    ON_ArcCurve::~ON_ArcCurve((ON_ArcCurve *)local_258);
    ON_Arc::~ON_Arc((ON_Arc *)local_178);
    ON_Circle::~ON_Circle((ON_Circle *)(arc.m_angle.m_t + 1));
  }
  else {
    if (hint == (int *)0x0) {
      local_2d8 = (int *)0x0;
    }
    else {
      local_2d8 = hint + dir;
    }
    iVar1 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                      (SUB84(t0,0),t1,cos_angle_tolerance,curvature_tolerance,this->m_curve,(ulong)c
                       ,t,local_2d8,dtype);
    circle.radius._7_1_ = (bool)((byte)iVar1 & 1);
  }
  return circle.radius._7_1_;
}

Assistant:

bool ON_RevSurface::GetNextDiscontinuity( 
                int dir,
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  // 28 Jan 2005 - untested code
  bool rc = false;
  if ( (m_bTransposed ? 1 : 0) == dir )
  {
    // angle direction
    ON_Circle circle(ON_xy_plane,1.0);
    ON_Arc arc( circle, m_angle );
    ON_ArcCurve arc_curve(arc, m_t[0], m_t[1]);
    rc = arc_curve.GetNextDiscontinuity(
      c,
      t0,t1,t,
      (hint? &hint[dir] : 0),
      dtype,cos_angle_tolerance,
      curvature_tolerance);
  }
  else
  {
    rc = m_curve->GetNextDiscontinuity(
      c,
      t0,t1,t,
      (hint? &hint[dir] : 0),
      dtype,cos_angle_tolerance,
      curvature_tolerance);
  }
  return rc;
}